

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt6CheckOutDec(word t,int i,word *pOut)

{
  word wVar1;
  word wVar2;
  int iVar3;
  
  wVar1 = Abc_Tt6Cofactor0(t,i);
  wVar2 = Abc_Tt6Cofactor1(t,i);
  if (wVar1 == wVar2) {
    __assert_fail("c0 != c1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xa7f,"int Abc_Tt6CheckOutDec(word, int, word *)");
  }
  if (wVar1 == 0) {
    iVar3 = 0;
    wVar1 = wVar2;
  }
  else if (wVar2 == 0) {
    iVar3 = 1;
  }
  else if (wVar1 == 0xffffffffffffffff) {
    iVar3 = 2;
    wVar1 = wVar2;
  }
  else if (wVar2 == 0xffffffffffffffff) {
    iVar3 = 3;
  }
  else {
    if ((wVar2 ^ wVar1) != 0xffffffffffffffff) {
      return -1;
    }
    iVar3 = 4;
  }
  if (pOut != (word *)0x0) {
    *pOut = wVar1;
  }
  return iVar3;
}

Assistant:

static inline int Abc_Tt6CheckOutDec( word t, int i, word * pOut )
{
    word c0 = Abc_Tt6Cofactor0( t, i );
    word c1 = Abc_Tt6Cofactor1( t, i );
    assert( c0 != c1 );
    if ( c0 == 0 ) //  F = i * G
    {
        if ( pOut ) *pOut = c1;
        return 0;
    }
    if ( c1 == 0 ) //  F = ~i * G
    {
        if ( pOut ) *pOut = c0;
        return 1;
    }
    if ( ~c0 == 0 ) //  F = ~i + G
    {
        if ( pOut ) *pOut = c1;
        return 2;
    }
    if ( ~c1 == 0 ) //  F = i + G
    {
        if ( pOut ) *pOut = c0;
        return 3;
    }
    if ( c0 == ~c1 ) //  F = i # G
    {
        if ( pOut ) *pOut = c0;
        return 4;
    }
    return -1;
}